

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const(&)[22]>
          (SmallVectorImpl<llvm::StringRef> *this,char (*Args) [22])

{
  uint uVar1;
  reference pSVar2;
  
  uVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity <= uVar1
     ) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::grow
              (&this->super_SmallVectorTemplateBase<llvm::StringRef,_true>,0);
    uVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  }
  StringRef::StringRef
            ((StringRef *)
             ((ulong)uVar1 * 0x10 +
             (long)(this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX),*Args);
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                    Size + 1);
  pSVar2 = SmallVectorTemplateCommon<llvm::StringRef,_void>::back
                     ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)this);
  return pSVar2;
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }